

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::PrimitiveTypeName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Options *options,CppType type)

{
  uint uVar1;
  char *pcVar2;
  char *in_R8;
  string_view type_00;
  _anonymous_namespace_ *p_Stack_20;
  LogMessageFatal aLStack_18 [16];
  
  uVar1 = (int)options - 1;
  if (9 < uVar1) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/helpers.cc"
               ,0x2e0);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)aLStack_18,(char (*) [16])"Can\'t get here.");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_18);
  }
  type_00._M_len =
       (long)&switchD_001aed6a::switchdataD_003463d0 +
       (long)(int)(&switchD_001aed6a::switchdataD_003463d0)[uVar1];
  switch((int)options) {
  case 1:
    pcVar2 = "uint32";
    goto LAB_001aedab;
  case 2:
    pcVar2 = "uint64";
LAB_001aedab:
    pcVar2 = pcVar2 + 1;
    p_Stack_20 = (_anonymous_namespace_ *)0x5;
LAB_001aedad:
    type_00._M_str = in_R8;
    (anonymous_namespace)::IntTypeName_abi_cxx11_
              (__return_storage_ptr__,p_Stack_20,(Options *)pcVar2,type_00);
    return __return_storage_ptr__;
  case 3:
    pcVar2 = "uint32";
    goto LAB_001aed97;
  case 4:
    pcVar2 = "uint64";
LAB_001aed97:
    p_Stack_20 = (_anonymous_namespace_ *)0x6;
    goto LAB_001aedad;
  case 5:
    pcVar2 = "double";
    break;
  case 6:
    pcVar2 = "float";
    break;
  case 7:
    pcVar2 = "bool";
    break;
  case 8:
    pcVar2 = "int";
    break;
  case 9:
    pcVar2 = "std::string";
    break;
  case 10:
    pcVar2 = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar2,(allocator<char> *)aLStack_18);
  return __return_storage_ptr__;
}

Assistant:

std::string PrimitiveTypeName(const Options& options,
                              FieldDescriptor::CppType type) {
  switch (type) {
    case FieldDescriptor::CPPTYPE_INT32:
      return IntTypeName(options, "int32");
    case FieldDescriptor::CPPTYPE_INT64:
      return IntTypeName(options, "int64");
    case FieldDescriptor::CPPTYPE_UINT32:
      return IntTypeName(options, "uint32");
    case FieldDescriptor::CPPTYPE_UINT64:
      return IntTypeName(options, "uint64");
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return "double";
    case FieldDescriptor::CPPTYPE_FLOAT:
      return "float";
    case FieldDescriptor::CPPTYPE_BOOL:
      return "bool";
    case FieldDescriptor::CPPTYPE_ENUM:
      return "int";
    case FieldDescriptor::CPPTYPE_STRING:
      return "std::string";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "";

      // No default because we want the compiler to complain if any new
      // CppTypes are added.
  }

  ABSL_LOG(FATAL) << "Can't get here.";
  return "";
}